

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1b575::CpuTest_jmp_Test::TestBody(CpuTest_jmp_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *rhs;
  undefined2 uVar1;
  undefined2 uVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  char *message;
  ReturnAction<int> RStack_88;
  MatcherBase<unsigned_short> local_78;
  _Any_data local_60 [2];
  AssertionResult gtest_ar;
  
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'L');
  (this->super_CpuTest).expected.pc = 0x1234;
  this_00 = &(this->super_CpuTest).mmu;
  uVar1 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,uVar1 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x136,"mmu","read_byte(registers.pc + 1u)");
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_88,0x34);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  rhs = &(this->super_CpuTest).registers;
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  uVar2 = rhs->pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,uVar2 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x137,"mmu","read_byte(registers.pc + 2u)");
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_88,0x12);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x03');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)&gtest_ar,"expected","registers",&(this->super_CpuTest).expected,rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x13b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_60[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_60[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, jmp) {
    stage_instruction(JMP);
    expected.pc = 0x1234;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));

    step_execution(3);

    EXPECT_EQ(expected, registers);
}